

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_test.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  shared_ptr<Thread> ptThread;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vec;
  undefined1 local_59;
  value_type local_58;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> local_48;
  
  local_48.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = 100;
  do {
    local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Thread *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Thread,std::allocator<Thread>,void(&)()>
              (&local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (Thread **)&local_58,(allocator<Thread> *)&local_59,addGlobal);
    Thread::Start(local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
              (&local_48,&local_58);
    if (local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  lVar2 = 0;
  do {
    Thread::Join(*(Thread **)
                  ((long)&((local_48.
                            super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x640);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,globalVal);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            (&local_48);
  return 0;
}

Assistant:

int main()
{
	vector<shared_ptr<Thread>> vec;
	for (int i = 0; i < 100; ++i)
	{
		shared_ptr<Thread> ptThread = make_shared<Thread> (addGlobal);
		ptThread->Start();
		vec.push_back(ptThread);
	}
	
	for (int i = 0; i < 100; ++i)
	{
		vec[i]->Join();
	}
	
	cout << globalVal << endl;
}